

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression *
slang::ast::Expression::bindName
          (Compilation *comp,NameSyntax *syntax,InvocationExpressionSyntax *invocation,
          ArrayOrRandomizeMethodExpressionSyntax *withClause,ASTContext *context)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  LanguageVersion LVar9;
  long in_RDX;
  Compilation *in_R8;
  SystemCallInfo callInfo;
  SourceRange callRange;
  LookupResult result;
  LookupResult result_3;
  LookupResult result_2;
  LookupResult result_1;
  bitmask<slang::ast::LookupFlags> flags;
  Compilation *in_stack_fffffffffffff458;
  SourceLocation in_stack_fffffffffffff460;
  SourceRange SVar10;
  bitmask<slang::ast::ASTFlags> *in_stack_fffffffffffff468;
  bitmask<slang::ast::ASTFlags> *in_stack_fffffffffffff470;
  LookupResult *in_stack_fffffffffffff498;
  SyntaxNode *in_stack_fffffffffffff4b0;
  not_null<const_slang::ast::SystemSubroutine_*> local_a08;
  Segment *local_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  SourceRange local_9d8;
  underlying_type local_9c4;
  SystemSubroutine *local_9b8 [7];
  ASTContext *in_stack_fffffffffffff680;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_fffffffffffff688;
  InvocationExpressionSyntax *in_stack_fffffffffffff690;
  Expression *in_stack_fffffffffffff698;
  Subroutine *in_stack_fffffffffffff6a0;
  Compilation *in_stack_fffffffffffff6a8;
  SourceRange in_stack_fffffffffffff6c0;
  LookupResult *in_stack_fffffffffffff750;
  NameSyntax *in_stack_fffffffffffff758;
  TempVarSymbol *in_stack_fffffffffffff760;
  Scope *in_stack_fffffffffffff768;
  LookupResult *in_stack_fffffffffffff788;
  NameSyntax *in_stack_fffffffffffff790;
  ASTContext *in_stack_fffffffffffff798;
  LookupResult *in_stack_fffffffffffff830;
  ASTContext *in_stack_fffffffffffff838;
  NameSyntax *in_stack_fffffffffffff840;
  bitmask<slang::ast::LookupFlags> in_stack_fffffffffffff84c;
  LookupResult *in_stack_fffffffffffff858;
  NameSyntax *in_stack_fffffffffffff860;
  ASTContext *in_stack_fffffffffffff868;
  bitmask<slang::ast::LookupFlags> in_stack_fffffffffffff870;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_fffffffffffff980;
  InvocationExpressionSyntax *in_stack_fffffffffffff988;
  LookupResult *in_stack_fffffffffffff990;
  Compilation *in_stack_fffffffffffff998;
  SourceRange in_stack_fffffffffffff9a0;
  ASTContext *in_stack_fffffffffffff9c0;
  bitmask<slang::ast::LookupFlags> local_6c;
  bitmask<slang::ast::ASTFlags> local_68;
  bitmask<slang::ast::LookupFlags> local_5c;
  bitmask<slang::ast::ASTFlags> local_58;
  bitmask<slang::ast::LookupFlags> local_4c;
  bitmask<slang::ast::ASTFlags> local_48;
  bitmask<slang::ast::LookupFlags> local_3c;
  bitmask<slang::ast::CompilationFlags> local_38;
  bitmask<slang::ast::LookupFlags> local_34;
  Compilation *local_30;
  long local_20;
  Expression *local_8;
  
  local_30 = in_R8;
  local_20 = in_RDX;
  bitmask<slang::ast::LookupFlags>::bitmask(&local_34,None);
  if ((local_20 == 0) || (*(long *)(local_20 + 0x58) == 0)) {
    bitmask<slang::ast::CompilationFlags>::bitmask(&local_38,AllowUseBeforeDeclare);
    bVar7 = Compilation::hasFlag
                      (in_stack_fffffffffffff458,
                       (bitmask<slang::ast::CompilationFlags>)in_stack_fffffffffffff460._4_4_);
    if (!bVar7) goto LAB_0125a80b;
  }
  bitmask<slang::ast::LookupFlags>::bitmask(&local_3c,AllowDeclaredAfter);
  bitmask<slang::ast::LookupFlags>::operator|=(&local_34,&local_3c);
LAB_0125a80b:
  bitmask<slang::ast::ASTFlags>::bitmask(&local_48,StaticInitializer);
  bVar7 = bitmask<slang::ast::ASTFlags>::has(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  if (bVar7) {
    bitmask<slang::ast::LookupFlags>::bitmask(&local_4c,StaticInitializer);
    bitmask<slang::ast::LookupFlags>::operator|=(&local_34,&local_4c);
  }
  bitmask<slang::ast::ASTFlags>::bitmask(&local_58,BindInstantiation);
  bVar7 = bitmask<slang::ast::ASTFlags>::has(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  if (bVar7) {
    local_5c = ast::operator|(in_stack_fffffffffffff460._0_4_,
                              (LookupFlags)((ulong)in_stack_fffffffffffff458 >> 0x20));
    bitmask<slang::ast::LookupFlags>::operator|=(&local_34,&local_5c);
  }
  bitmask<slang::ast::ASTFlags>::bitmask(&local_68,TypeOperator);
  bVar8 = bitmask<slang::ast::ASTFlags>::has(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  bVar7 = false;
  if (bVar8) {
    LVar9 = Compilation::languageVersion((Compilation *)0x125a943);
    bVar7 = 0 < (int)LVar9;
  }
  if (bVar7) {
    local_6c = ast::operator|(in_stack_fffffffffffff460._0_4_,
                              (LookupFlags)((ulong)in_stack_fffffffffffff458 >> 0x20));
    bitmask<slang::ast::LookupFlags>::operator|=(&local_34,&local_6c);
  }
  lVar1._0_4_ = (local_30->options).maxConstexprDepth;
  lVar1._4_4_ = (local_30->options).maxConstexprSteps;
  if (((lVar1 != 0) ||
      (lVar2._0_4_ = (local_30->options).maxConstexprBacktrace,
      lVar2._4_4_ = (local_30->options).maxDefParamSteps, lVar2 != 0)) ||
     (lVar3._0_4_ = (local_30->options).maxInstanceArray,
     lVar3._4_4_ = (local_30->options).maxRecursiveClassSpecialization, lVar3 != 0)) {
    lVar4._0_4_ = (local_30->options).maxConstexprDepth;
    lVar4._4_4_ = (local_30->options).maxConstexprSteps;
    if (lVar4 != 0) {
      LookupResult::LookupResult((LookupResult *)in_stack_fffffffffffff460);
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0x125a9e6);
      bVar7 = Lookup::findTempVar(in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                                  in_stack_fffffffffffff758,in_stack_fffffffffffff750);
      if (bVar7) {
        LookupResult::reportDiags
                  ((LookupResult *)in_stack_fffffffffffff460,(ASTContext *)in_stack_fffffffffffff458
                  );
        slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff4b0);
        in_stack_fffffffffffff458 = local_30;
        local_8 = bindLookupResult(in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                                   in_stack_fffffffffffff9a0,in_stack_fffffffffffff988,
                                   in_stack_fffffffffffff980,in_stack_fffffffffffff9c0);
      }
      LookupResult::~LookupResult((LookupResult *)in_stack_fffffffffffff460);
      if (bVar7) {
        return local_8;
      }
    }
    lVar5._0_4_ = (local_30->options).maxConstexprBacktrace;
    lVar5._4_4_ = (local_30->options).maxDefParamSteps;
    if ((lVar5 != 0) && (**(long **)&(local_30->options).maxConstexprBacktrace != 0)) {
      LookupResult::LookupResult((LookupResult *)in_stack_fffffffffffff460);
      bVar7 = Lookup::withinClassRandomize
                        (in_stack_fffffffffffff868,in_stack_fffffffffffff860,
                         in_stack_fffffffffffff870,in_stack_fffffffffffff858);
      if (bVar7) {
        LookupResult::reportDiags
                  ((LookupResult *)in_stack_fffffffffffff460,(ASTContext *)in_stack_fffffffffffff458
                  );
        slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff4b0);
        in_stack_fffffffffffff458 = local_30;
        local_8 = bindLookupResult(in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                                   in_stack_fffffffffffff9a0,in_stack_fffffffffffff988,
                                   in_stack_fffffffffffff980,in_stack_fffffffffffff9c0);
        bVar7 = true;
      }
      else {
        bVar7 = LookupResult::hasError(in_stack_fffffffffffff498);
        if (bVar7) {
          LookupResult::reportDiags
                    ((LookupResult *)in_stack_fffffffffffff460,
                     (ASTContext *)in_stack_fffffffffffff458);
          local_8 = badExpr((Compilation *)in_stack_fffffffffffff460,
                            (Expression *)in_stack_fffffffffffff458);
          bVar7 = true;
        }
        else {
          bVar7 = false;
        }
      }
      LookupResult::~LookupResult((LookupResult *)in_stack_fffffffffffff460);
      if (bVar7) {
        return local_8;
      }
    }
    lVar6._0_4_ = (local_30->options).maxInstanceArray;
    lVar6._4_4_ = (local_30->options).maxRecursiveClassSpecialization;
    if (lVar6 != 0) {
      LookupResult::LookupResult((LookupResult *)in_stack_fffffffffffff460);
      bVar7 = Lookup::findAssertionLocalVar
                        (in_stack_fffffffffffff798,in_stack_fffffffffffff790,
                         in_stack_fffffffffffff788);
      if (bVar7) {
        LookupResult::reportDiags
                  ((LookupResult *)in_stack_fffffffffffff460,(ASTContext *)in_stack_fffffffffffff458
                  );
        slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff4b0);
        in_stack_fffffffffffff458 = local_30;
        local_8 = bindLookupResult(in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                                   in_stack_fffffffffffff9a0,in_stack_fffffffffffff988,
                                   in_stack_fffffffffffff980,in_stack_fffffffffffff9c0);
      }
      LookupResult::~LookupResult((LookupResult *)in_stack_fffffffffffff460);
      if (bVar7) {
        return local_8;
      }
    }
  }
  LookupResult::LookupResult((LookupResult *)in_stack_fffffffffffff460);
  local_9c4 = local_34.m_bits;
  Lookup::name(in_stack_fffffffffffff840,in_stack_fffffffffffff838,in_stack_fffffffffffff84c,
               in_stack_fffffffffffff830);
  LookupResult::reportDiags
            ((LookupResult *)in_stack_fffffffffffff460,(ASTContext *)in_stack_fffffffffffff458);
  if (local_9b8[0] == (SystemSubroutine *)0x0) {
    slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff4b0);
    local_8 = bindLookupResult(in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                               in_stack_fffffffffffff9a0,in_stack_fffffffffffff988,
                               in_stack_fffffffffffff980,in_stack_fffffffffffff9c0);
  }
  else {
    if (local_20 == 0) {
      local_9d8 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff4b0);
    }
    else {
      local_9d8 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff4b0);
    }
    not_null<const_slang::ast::SystemSubroutine_*>::not_null<const_slang::ast::SystemSubroutine_*&>
              (&local_a08,local_9b8);
    local_a00 = (local_30->super_BumpAllocator).head;
    local_9e8 = 0;
    uStack_9e0 = 0;
    local_9f8 = 0;
    uStack_9f0 = 0;
    std::
    variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
    ::variant((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
               *)0x125b01e);
    std::variant<slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>::
    variant<slang::ast::CallExpression::SystemCallInfo&,void,void,slang::ast::CallExpression::SystemCallInfo,void>
              ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                *)in_stack_fffffffffffff460,(SystemCallInfo *)in_stack_fffffffffffff458);
    SVar10 = local_9d8;
    local_8 = CallExpression::fromLookup
                        (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
                         in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                         in_stack_fffffffffffff688,in_stack_fffffffffffff6c0,
                         in_stack_fffffffffffff680);
    in_stack_fffffffffffff460 = SVar10.endLoc;
  }
  LookupResult::~LookupResult((LookupResult *)in_stack_fffffffffffff460);
  return local_8;
}

Assistant:

Expression& Expression::bindName(Compilation& comp, const NameSyntax& syntax,
                                 const InvocationExpressionSyntax* invocation,
                                 const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                 const ASTContext& context) {
    bitmask<LookupFlags> flags = LookupFlags::None;
    if ((invocation && invocation->arguments) ||
        comp.hasFlag(CompilationFlags::AllowUseBeforeDeclare)) {
        flags |= LookupFlags::AllowDeclaredAfter;
    }

    if (context.flags.has(ASTFlags::StaticInitializer))
        flags |= LookupFlags::StaticInitializer;

    if (context.flags.has(ASTFlags::BindInstantiation))
        flags |= LookupFlags::DisallowWildcardImport | LookupFlags::DisallowUnitReferences;

    if (context.flags.has(ASTFlags::TypeOperator) &&
        comp.languageVersion() >= LanguageVersion::v1800_2023) {
        // v1800-2023: Type operator expressions are allowed to reference
        // incomplete forward class types now.
        flags |= LookupFlags::AllowIncompleteForwardTypedefs | LookupFlags::TypeReference;
    }

    // Special case scenarios: temporary variables, class-scoped randomize calls,
    // and expanding sequences and properties.
    if (context.firstTempVar || context.randomizeDetails || context.assertionInstance) {
        // If we have any temporary variables, they need to be findable even though they aren't
        // added to any scope. Check for that case and manually look for its name here.
        if (context.firstTempVar) {
            LookupResult result;
            if (Lookup::findTempVar(*context.scope, *context.firstTempVar, syntax, result)) {
                result.reportDiags(context);
                return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause,
                                        context);
            }
        }

        if (context.randomizeDetails && context.randomizeDetails->classType) {
            // Inside a class-scoped randomize call, first do a lookup in the class scope.
            // If it's not found, we proceed to do a normal lookup.
            LookupResult result;
            if (Lookup::withinClassRandomize(context, syntax, flags, result)) {
                result.reportDiags(context);
                return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause,
                                        context);
            }
            else if (result.hasError()) {
                result.reportDiags(context);
                return badExpr(comp, nullptr);
            }
        }

        if (context.assertionInstance) {
            // Look for a matching local assertion variable.
            LookupResult result;
            if (Lookup::findAssertionLocalVar(context, syntax, result)) {
                result.reportDiags(context);
                return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause,
                                        context);
            }
        }
    }

    // Normal name lookup and resolution.
    LookupResult result;
    Lookup::name(syntax, context, flags, result);
    result.reportDiags(context);

    if (result.systemSubroutine) {
        // There won't be any selectors here; this gets checked in the lookup call.
        SLANG_ASSERT(result.selectors.empty());

        SourceRange callRange = invocation ? invocation->sourceRange() : syntax.sourceRange();
        CallExpression::SystemCallInfo callInfo{result.systemSubroutine, context.scope, {}};
        return CallExpression::fromLookup(comp, callInfo, nullptr, invocation, withClause,
                                          callRange, context);
    }

    return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause, context);
}